

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O3

GCproto * lj_bcread(LexState *ls)

{
  char **pp;
  uint uVar1;
  lua_State *L;
  uint32_t uVar2;
  size_t lenx;
  GCstr *pGVar3;
  GCproto *pGVar4;
  char *pcVar5;
  TValue *pTVar6;
  lua_State *plVar7;
  char *pcVar8;
  
  L = ls->L;
  pcVar8 = ls->p;
  ls->lastline = *(int *)&L->top - (L->stack).ptr32;
  (ls->sb).p.ptr32 = (ls->sb).b.ptr32;
  pp = &ls->p;
  if ((uint)(*(int *)&ls->pe - (int)pcVar8) < 0xd) {
    bcread_fill(ls,0xd,0);
    pcVar8 = ls->p;
  }
  *pp = pcVar8 + 1;
  if (((*pcVar8 == 'L') && (*pp = pcVar8 + 2, pcVar8[1] == 'J')) &&
     (*pp = pcVar8 + 3, pcVar8[2] == '\x02')) {
    uVar2 = lj_buf_ruleb128(pp);
    ls->level = uVar2;
    if (uVar2 < 8) {
      if ((3 < uVar2) && (plVar7 = ls->L, *(int *)((ulong)(plVar7->glref).ptr32 + 0x194) == 0)) {
        pTVar6 = plVar7->top;
        uVar1 = (plVar7->stack).ptr32;
        luaopen_ffi(plVar7);
        plVar7->top = (TValue *)((long)pTVar6 + ((ulong)(plVar7->stack).ptr32 - (ulong)uVar1));
      }
      if ((uVar2 & 2) == 0) {
        uVar2 = lj_buf_ruleb128(pp);
        pcVar8 = ls->p;
        if ((uint)(*(int *)&ls->pe - (int)pcVar8) < uVar2) {
          bcread_fill(ls,uVar2,1);
          pcVar8 = ls->p;
        }
        plVar7 = ls->L;
        lenx = (size_t)uVar2;
        ls->p = pcVar8 + lenx;
      }
      else {
        plVar7 = ls->L;
        pcVar8 = ls->chunkarg;
        lenx = strlen(pcVar8);
      }
      pGVar3 = lj_str_new(plVar7,pcVar8,lenx);
      ls->chunkname = pGVar3;
      while( true ) {
        pcVar8 = ls->p;
        pcVar5 = ls->pe;
        if ((pcVar8 < pcVar5) && (*pcVar8 == '\0')) break;
        if ((uint)((int)pcVar5 - (int)pcVar8) < 5) {
          bcread_fill(ls,5,0);
        }
        uVar2 = lj_buf_ruleb128(pp);
        pcVar8 = ls->p;
        pcVar5 = ls->pe;
        if (uVar2 == 0) goto LAB_00123416;
        if ((uint)((int)pcVar5 - (int)pcVar8) < uVar2) {
          bcread_fill(ls,uVar2,1);
          pcVar8 = ls->p;
        }
        pGVar4 = lj_bcread_proto(ls);
        if (ls->p != pcVar8 + uVar2) goto LAB_00123481;
        pTVar6 = L->top;
        (pTVar6->u32).lo = (uint32_t)pGVar4;
        (pTVar6->field_2).it = 0xfffffff8;
        pTVar6 = L->top;
        L->top = pTVar6 + 1;
        if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar6 + 1) {
          lj_state_growstack1(L);
        }
      }
      pcVar8 = pcVar8 + 1;
      *pp = pcVar8;
LAB_00123416:
      if (((pcVar5 == pcVar8) || (ls->endmark != 0)) &&
         (pTVar6 = L->top + -1, pTVar6 == (TValue *)((long)ls->lastline + (ulong)(L->stack).ptr32)))
      {
        L->top = pTVar6;
        return (GCproto *)(ulong)(pTVar6->u32).lo;
      }
LAB_00123481:
      bcread_error((LexState *)ls->L,(ErrMsg)ls->chunkarg);
    }
  }
  bcread_error((LexState *)ls->L,(ErrMsg)ls->chunkarg);
}

Assistant:

GCproto *lj_bcread(LexState *ls)
{
  lua_State *L = ls->L;
  lj_assertLS(ls->c == BCDUMP_HEAD1, "bad bytecode header");
  bcread_savetop(L, ls, L->top);
  lj_buf_reset(&ls->sb);
  /* Check for a valid bytecode dump header. */
  if (!bcread_header(ls))
    bcread_error(ls, LJ_ERR_BCFMT);
  for (;;) {  /* Process all prototypes in the bytecode dump. */
    GCproto *pt;
    MSize len;
    const char *startp;
    /* Read length. */
    if (ls->p < ls->pe && ls->p[0] == 0) {  /* Shortcut EOF. */
      ls->p++;
      break;
    }
    bcread_want(ls, 5);
    len = bcread_uleb128(ls);
    if (!len) break;  /* EOF */
    bcread_need(ls, len);
    startp = ls->p;
    pt = lj_bcread_proto(ls);
    if (ls->p != startp + len)
      bcread_error(ls, LJ_ERR_BCBAD);
    setprotoV(L, L->top, pt);
    incr_top(L);
  }
  if ((ls->pe != ls->p && !ls->endmark) || L->top-1 != bcread_oldtop(L, ls))
    bcread_error(ls, LJ_ERR_BCBAD);
  /* Pop off last prototype. */
  L->top--;
  return protoV(L->top);
}